

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

opj_bool j2k_decode_v2(opj_j2k_v2_t *p_j2k,opj_stream_private_t *p_stream,opj_image_t *p_image,
                      opj_event_mgr_t *p_manager)

{
  opj_bool oVar1;
  opj_image_t *poVar2;
  opj_image_t *in_RCX;
  opj_stream_private_t *in_RDX;
  opj_procedure_list_t *in_RSI;
  opj_j2k_v2_t *in_RDI;
  OPJ_UINT32 compno;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar3;
  opj_bool local_4;
  
  if (in_RDX == (opj_stream_private_t *)0x0) {
    local_4 = 0;
  }
  else {
    poVar2 = opj_image_create0();
    in_RDI->m_output_image = poVar2;
    if (in_RDI->m_output_image == (opj_image_t *)0x0) {
      local_4 = 0;
    }
    else {
      opj_copy_image_header((opj_image_t *)in_RDX,in_RCX);
      j2k_setup_decoding((opj_j2k_v2_t *)0x141894);
      oVar1 = j2k_exec(in_RDI,in_RSI,in_RDX,(opj_event_mgr_t *)in_RCX);
      if (oVar1 == 0) {
        opj_image_destroy((opj_image_t *)
                          CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        in_RDI->m_private_image = (opj_image_t *)0x0;
        local_4 = 0;
      }
      else {
        for (uVar3 = 0; uVar3 < *(uint *)&in_RDX->m_read_fn; uVar3 = uVar3 + 1) {
          *(OPJ_UINT32 *)(in_RDX->m_write_fn + (ulong)uVar3 * 0x38 + 0x24) =
               in_RDI->m_output_image->comps[uVar3].resno_decoded;
          *(OPJ_INT32 **)(in_RDX->m_write_fn + (ulong)uVar3 * 0x38 + 0x30) =
               in_RDI->m_output_image->comps[uVar3].data;
          in_RDI->m_output_image->comps[uVar3].data = (OPJ_INT32 *)0x0;
        }
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

opj_bool j2k_decode_v2(	opj_j2k_v2_t * p_j2k,
						opj_stream_private_t * p_stream,
						opj_image_t * p_image,
						opj_event_mgr_t * p_manager)
{
	OPJ_UINT32 compno;

	if (!p_image)
		return OPJ_FALSE;

	p_j2k->m_output_image = opj_image_create0();
	if (! (p_j2k->m_output_image)) {
		return OPJ_FALSE;
	}
	opj_copy_image_header(p_image, p_j2k->m_output_image);

	/* customization of the decoding */
	j2k_setup_decoding(p_j2k);

	/* Decode the codestream */
	if (! j2k_exec (p_j2k,p_j2k->m_procedure_list,p_stream,p_manager)) {
		opj_image_destroy(p_j2k->m_private_image);
		p_j2k->m_private_image = NULL;
		return OPJ_FALSE;
	}

	/* Move data and copy one information from codec to output image*/
	for (compno = 0; compno < p_image->numcomps; compno++) {
		p_image->comps[compno].resno_decoded = p_j2k->m_output_image->comps[compno].resno_decoded;
		p_image->comps[compno].data = p_j2k->m_output_image->comps[compno].data;
		p_j2k->m_output_image->comps[compno].data = NULL;
	}

	return OPJ_TRUE;
}